

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

void cmDebugger_impl::WatchMethodCB
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  long lVar1;
  uint uVar2;
  ptr *watchpointPtr;
  
  if (((client_data != (void *)0x0) && (lVar1 = *client_data, lVar1 != 0)) &&
     (*(cmDebugger_impl **)(lVar1 + 0x30) != (cmDebugger_impl *)0x0)) {
    if ((uint)access_type < 2) {
      uVar2 = *(uint *)(lVar1 + 8) >> 2;
    }
    else if (access_type == 2) {
      uVar2 = *(uint *)(lVar1 + 8);
    }
    else if (access_type == 4) {
      uVar2 = *(uint *)(lVar1 + 8) >> 3;
    }
    else {
      if (access_type != 3) {
        return;
      }
      uVar2 = *(uint *)(lVar1 + 8) >> 1;
    }
    if ((uVar2 & 1) != 0) {
      OnWatchCallback(*(cmDebugger_impl **)(lVar1 + 0x30),variable,access_type,newValue);
      return;
    }
  }
  return;
}

Assistant:

static void WatchMethodCB(const std::string& variable, int access_type,
                            void* client_data, const char* newValue,
                            const cmMakefile* mf)
  {
    (void)mf;
    auto watchpointPtr = (Watchpoint::ptr*)client_data;
    if (watchpointPtr == CM_NULLPTR) {
      return;
    }

    auto watchpoint = watchpointPtr->get();
    if (watchpoint == CM_NULLPTR) {
      return;
    }

    auto debugger = watchpoint->debugger;
    if (debugger == CM_NULLPTR) {
      return;
    }

    bool isRead =
      (access_type == cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS) |
      (access_type == cmVariableWatch::VARIABLE_READ_ACCESS);
    bool isWrite = access_type == cmVariableWatch::VARIABLE_MODIFIED_ACCESS;
    bool isDefined =
      access_type == cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS;
    bool isUnset = access_type == cmVariableWatch::VARIABLE_REMOVED_ACCESS;

    bool matchesFilter =
      (isRead && watchpoint->Type & cmWatchpoint::WATCHPOINT_READ) |
      (isWrite && watchpoint->Type & cmWatchpoint::WATCHPOINT_WRITE) |
      (isDefined && watchpoint->Type & cmWatchpoint::WATCHPOINT_DEFINE) |
      (isUnset && watchpoint->Type & cmWatchpoint::WATCHPOINT_UNDEFINED);

    if (matchesFilter) {
      debugger->OnWatchCallback(variable, access_type, newValue);
    }
  }